

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  undefined8 *__ptr;
  undefined8 in_RDI;
  stbi__jpeg *j;
  uchar *result;
  int in_stack_0000012c;
  int *in_stack_00000130;
  int *in_stack_00000138;
  int *in_stack_00000140;
  stbi__jpeg *in_stack_00000148;
  char *in_stack_ffffffffffffffc0;
  stbi_uc *local_8;
  
  __ptr = (undefined8 *)stbi__malloc(0x42e49c);
  if (__ptr == (undefined8 *)0x0) {
    stbi__err(in_stack_ffffffffffffffc0);
    local_8 = (stbi_uc *)0x0;
  }
  else {
    *__ptr = in_RDI;
    stbi__setup_jpeg((stbi__jpeg *)0x42e4da);
    local_8 = load_jpeg_image(in_stack_00000148,in_stack_00000140,in_stack_00000138,
                              in_stack_00000130,in_stack_0000012c);
    free(__ptr);
  }
  return local_8;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}